

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.h
# Opt level: O0

optional<libchess::Color> libchess::Color::from(char c)

{
  int iVar1;
  char in_DIL;
  undefined4 in_stack_ffffffffffffffd8;
  value_type in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe4;
  undefined8 local_8;
  
  iVar1 = (int)in_DIL;
  if (iVar1 == 0x42) {
    Color((Color *)CONCAT44(in_stack_ffffffffffffffe4,0x42),in_stack_ffffffffffffffdc);
    std::optional<libchess::Color>::optional<libchess::Color,_true>
              ((optional<libchess::Color> *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
               (Color *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else if (iVar1 == 0x57) {
    Color((Color *)CONCAT44(in_stack_ffffffffffffffe4,0x57),in_stack_ffffffffffffffdc);
    std::optional<libchess::Color>::optional<libchess::Color,_true>
              ((optional<libchess::Color> *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
               (Color *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else if (iVar1 == 0x62) {
    Color((Color *)CONCAT44(in_stack_ffffffffffffffe4,0x62),in_stack_ffffffffffffffdc);
    std::optional<libchess::Color>::optional<libchess::Color,_true>
              ((optional<libchess::Color> *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
               (Color *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else if (iVar1 == 0x77) {
    Color((Color *)CONCAT44(in_stack_ffffffffffffffe4,0x77),in_stack_ffffffffffffffdc);
    std::optional<libchess::Color>::optional<libchess::Color,_true>
              ((optional<libchess::Color> *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
               (Color *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    std::optional<libchess::Color>::optional((optional<libchess::Color> *)0x10c750);
  }
  return (_Optional_base<libchess::Color,_true,_true>)
         (_Optional_base<libchess::Color,_true,_true>)local_8;
}

Assistant:

constexpr static std::optional<Color> from(char c) {
        switch (c) {
        case 'w':
            return Color{Value::WHITE};
        case 'b':
            return Color{Value::BLACK};
        case 'W':
            return Color{Value::WHITE};
        case 'B':
            return Color{Value::BLACK};
        default:
            return {};
        }
    }